

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O2

add_torrent_params * __thiscall
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
          error_code *ec)

{
  undefined4 in_stack_ffffffffffffff90;
  bdecode_node rd;
  
  bdecode(&rd,this,buffer,(error_code *)0x0,(int *)0x64,2000000,in_stack_ffffffffffffff90);
  if (((error_code *)buffer.m_len)->failed_ == true) {
    add_torrent_params::add_torrent_params
              (__return_storage_ptr__,(storage_constructor_type *)&stack0xffffffffffffff90);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff90);
  }
  else {
    read_resume_data(__return_storage_ptr__,&rd,(error_code *)buffer.m_len);
  }
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&rd);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(span<char const> buffer, error_code& ec)
	{
		bdecode_node rd = bdecode(buffer, ec);
		if (ec) return add_torrent_params();

		return read_resume_data(rd, ec);
	}